

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

int labldef(int lval,int flag)

{
  uint uStack_10;
  char c;
  int flag_local;
  int lval_local;
  
  if (lablptr == (t_symbol *)0x0) {
    return 0;
  }
  uStack_10 = lval;
  if (flag != 0) {
    uStack_10 = lval & 0x1fffU | page << 0xd;
  }
  if (pass != 0) {
    if ((lablptr->value != uStack_10) ||
       (((flag != 0 && (bank < bank_limit)) && (lablptr->bank != bank_base + bank)))) {
      fatal_error("Internal error[1]!");
      return -1;
    }
    goto LAB_00117b47;
  }
  switch(lablptr->type) {
  case 1:
    lablptr->type = 4;
    lablptr->value = uStack_10;
    goto LAB_00117b47;
  case 2:
    error("Can not define this label, declared as undefined in an IF expression!");
    flag_local = -1;
    break;
  default:
    if (lablptr->reserved != 0) {
      fatal_error("Reserved symbol!");
      return -1;
    }
    if (lablptr->value != uStack_10) {
      lablptr->type = 3;
      lablptr->value = 0;
      error("Label multiply defined!");
      return -1;
    }
LAB_00117b47:
    if (flag != 0) {
      if (section == 2) {
        lablptr->proc = proc_ptr;
      }
      if ((section == 1) || (section == 0)) {
        lablptr->bank = bank;
      }
      else {
        lablptr->bank = bank_base + bank;
      }
      lablptr->page = page;
      if ((lablptr->name[1] == '.') || (lablptr->name[1] == '@')) {
        lastlabl = (t_symbol *)0x0;
      }
      else {
        glablptr = lablptr;
        lastlabl = lablptr;
      }
    }
    flag_local = 0;
    break;
  case 5:
    error("Symbol already used by a macro!");
    flag_local = -1;
    break;
  case 6:
    error("Symbol already used by a function!");
    flag_local = -1;
  }
  return flag_local;
}

Assistant:

int
labldef(int lval, int flag)
{
	char c;

	/* check for NULL ptr */
	if (lablptr == NULL)
		return (0);

	/* adjust symbol address */
	if (flag)
		lval = (lval & 0x1FFF) | (page << 13);

	/* first pass */
	if (pass == FIRST_PASS) {
		switch (lablptr->type) {
		/* undefined */
		case UNDEF:
			lablptr->type = DEFABS;
			lablptr->value = lval;
			break;

		/* already defined - error */
		case IFUNDEF:
			error("Can not define this label, declared as undefined in an IF expression!");
			return (-1);

		case MACRO:
			error("Symbol already used by a macro!");
			return (-1);

		case FUNC:
			error("Symbol already used by a function!");
			return (-1);

		default:
			/* reserved label */
			if (lablptr->reserved) {
				fatal_error("Reserved symbol!");
				return (-1);
			}

			/* compare the values */
			if (lablptr->value == lval)
				break;

			/* normal label */
			lablptr->type = MDEF;
			lablptr->value = 0;
			error("Label multiply defined!");
			return (-1);
		}
	}

	/* second pass */
	else {
		if ((lablptr->value != lval) ||
		   ((flag) && (bank < bank_limit) && (lablptr->bank  != bank_base + bank)))
		{
			fatal_error("Internal error[1]!");
			return (-1);
		}
	}

	/* update symbol data */
	if (flag) {
		if (section == S_CODE)
			lablptr->proc = proc_ptr;

		if ((section == S_BSS) || (section == S_ZP))
		{
			lablptr->bank = bank;
		} else {
			lablptr->bank = bank_base + bank;
		}
		lablptr->page = page;

		/* check if it's a local or global symbol */
		c = lablptr->name[1];
		if (c == '.' || c == '@')
			/* local */
			lastlabl = NULL;
		else {
			/* global */
			glablptr = lablptr;
			lastlabl = lablptr;
		}
	}

	/* ok */
	return (0);
}